

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall hdc::Lex::getNextToken(Lex *this)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  
  uVar3 = (ulong)this->idx;
  if (uVar3 < (this->buffer)._M_string_length) {
    cVar1 = (this->buffer)._M_dataplus._M_p[uVar3];
    if (cVar1 == '#') {
      skipComment(this);
      return;
    }
    if (cVar1 == '\n') {
      if (this->newline == false) {
        sVar4 = std::deque<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>::size
                          (&(this->blockStack).c);
        if (sVar4 == 0) {
          createToken(this,TK_NEWLINE);
        }
      }
      advance(this);
      return;
    }
    if (this->newline == false) {
      if (cVar1 == '\'') {
        getSingleQuoteString(this);
        return;
      }
      if (cVar1 == '\"') {
        getDoubleQuoteString(this);
        return;
      }
      if (cVar1 == ' ') {
        skipWhitespace(this);
        return;
      }
LAB_00154090:
      if ((byte)(cVar1 - 0x30U) < 10) {
        getNumber(this);
        return;
      }
      bVar2 = isAlpha(this);
      if (bVar2) {
        getKeywordOrIdentifier(this);
        return;
      }
      bVar2 = isOperator(this);
      if (bVar2) {
        getOperator(this);
        return;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,cVar1);
      std::operator<<(poVar5,"\n");
      return;
    }
  }
  else if (this->newline == false) {
    cVar1 = (this->buffer)._M_dataplus._M_p[uVar3];
    goto LAB_00154090;
  }
  getIndentation(this);
  return;
}

Assistant:

void Lex::getNextToken() {
    if (lookahead('\n')) {
        if (!newline && blockStack.size() == 0) {
            createToken(TK_NEWLINE);
        }

        advance();
    } else if (lookahead('#')) {
        skipComment();
    } else if (newline) {
        getIndentation();
    } else if (lookahead(' ')) {
        skipWhitespace();
    } else if (lookahead('"')) {
        getDoubleQuoteString();
    } else if (lookahead('\'')) {
        getSingleQuoteString();
    } else if (isDigit()) {
        getNumber();
    } else if (isAlpha()) {
        getKeywordOrIdentifier();
    } else if (isOperator()) {
        getOperator();
    } else {
        std::cout << buffer[idx] << "\n";
    }
}